

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

void Macro_smpsHeaderDAC(uint arg_count,long *arg_array)

{
  uchar local_28;
  uchar local_20;
  long *arg_array_local;
  uint arg_count_local;
  
  if (arg_count != 0) {
    CheckedChannelPointer((uint)*arg_array);
    if (arg_count < 2) {
      local_20 = '\0';
    }
    else {
      local_20 = (uchar)arg_array[1];
    }
    WriteByte(local_20);
    if (arg_count < 3) {
      local_28 = '\0';
    }
    else {
      local_28 = (uchar)arg_array[2];
    }
    WriteByte(local_28);
    return;
  }
  __assert_fail("arg_count >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                ,0x1c0,"void Macro_smpsHeaderDAC(unsigned int, long *)");
}

Assistant:

static void Macro_smpsHeaderDAC(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 1);

	CheckedChannelPointer(arg_array[0]);		// Location
	WriteByte((arg_count >= 2) ? arg_array[1] : 0);	// Pitch
	WriteByte((arg_count >= 3) ? arg_array[2] : 0);	// Volume
}